

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void __thiscall CCharmapToLocal::~CCharmapToLocal(CCharmapToLocal *this)

{
  CCharmap *in_RDI;
  size_t i;
  ulong local_10;
  
  in_RDI->_vptr_CCharmap = (_func_int **)&PTR__CCharmapToLocal_003cc9f8;
  if (in_RDI[0x101]._vptr_CCharmap != (_func_int **)0x0) {
    free(in_RDI[0x101]._vptr_CCharmap);
  }
  if (in_RDI[0x102]._vptr_CCharmap != (_func_int **)0x0) {
    free(in_RDI[0x102]._vptr_CCharmap);
  }
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    if ((&in_RDI[1]._vptr_CCharmap)[local_10] != (_func_int **)0x0) {
      free((&in_RDI[1]._vptr_CCharmap)[local_10]);
    }
  }
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    if ((&in_RDI[0x81]._vptr_CCharmap)[local_10] != (_func_int **)0x0) {
      free((&in_RDI[0x81]._vptr_CCharmap)[local_10]);
    }
  }
  CCharmap::~CCharmap(in_RDI);
  return;
}

Assistant:

CCharmapToLocal::~CCharmapToLocal()
{
    size_t i;

    /* delete the translation array */
    if (xlat_array_ != 0)
        t3free(xlat_array_);

    /* delete the expansion array */
    if (exp_array_ != 0)
        t3free(exp_array_);

    /* delete any mapping tables we've allocated */
    for (i = 0 ; i < sizeof(map_)/sizeof(map_[0]) ; ++i)
    {
        /* delete this mapping if allocated */
        if (map_[i] != 0)
            t3free(map_[i]);
    }

    /* delete any expansion mapping tables */
    for (i = 0 ; i < sizeof(exp_map_)/sizeof(exp_map_[0]) ; ++i)
    {
        /* delete this expansion mapping if allocated */
        if (exp_map_[i] != 0)
            t3free(exp_map_[i]);
    }
}